

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

ExpEmit __thiscall FxStringCast::Emit(FxStringCast *this,VMFunctionBuilder *build)

{
  ExpEmit EVar1;
  ExpEmit EVar2;
  ExpEmit local_28;
  ExpEmit from;
  VMFunctionBuilder *build_local;
  FxStringCast *this_local;
  ExpEmit to;
  undefined4 extraout_var;
  
  from = (ExpEmit)build;
  EVar2._0_4_ = (*this->basex->_vptr_FxExpression[9])(this->basex,build);
  EVar2.Konst = (bool)(char)extraout_var;
  EVar2.Fixed = (bool)(char)((uint)extraout_var >> 8);
  EVar2.Final = (bool)(char)((uint)extraout_var >> 0x10);
  EVar2.Target = (bool)(char)((uint)extraout_var >> 0x18);
  local_28.Konst = SUB41(extraout_var,0);
  local_28 = EVar2;
  if (((local_28.Konst ^ 0xffU) & 1) != 0) {
    ExpEmit::Free(&local_28,(VMFunctionBuilder *)from);
    ExpEmit::ExpEmit((ExpEmit *)&this_local,(VMFunctionBuilder *)from,2,1);
    if (this->basex->ValueType == (PType *)TypeName) {
      VMFunctionBuilder::Emit
                ((VMFunctionBuilder *)from,0x3e,(uint)(ushort)this_local,(uint)local_28.RegNum,0xb);
    }
    else if (this->basex->ValueType == (PType *)TypeSound) {
      VMFunctionBuilder::Emit
                ((VMFunctionBuilder *)from,0x3e,(uint)(ushort)this_local,(uint)local_28.RegNum,0xf);
    }
    EVar1.RegType = this_local._2_1_;
    EVar1.RegCount = this_local._3_1_;
    EVar1.Konst = (bool)this_local._4_1_;
    EVar1.Fixed = (bool)this_local._5_1_;
    EVar1.Final = (bool)this_local._6_1_;
    EVar1.Target = (bool)this_local._7_1_;
    EVar1.RegNum = (ushort)this_local;
    return EVar1;
  }
  __assert_fail("!from.Konst",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                ,0x4a3,"virtual ExpEmit FxStringCast::Emit(VMFunctionBuilder *)");
}

Assistant:

ExpEmit FxStringCast::Emit(VMFunctionBuilder *build)
{
	ExpEmit from = basex->Emit(build);
	assert(!from.Konst);

	from.Free(build);
	ExpEmit to(build, REGT_STRING);
	if (basex->ValueType == TypeName)
	{
		build->Emit(OP_CAST, to.RegNum, from.RegNum, CAST_N2S);
	}
	else if (basex->ValueType == TypeSound)
	{
		build->Emit(OP_CAST, to.RegNum, from.RegNum, CAST_So2S);
	}
	return to;
}